

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)

{
  long lVar1;
  long in_FS_OFFSET;
  QCoreApplicationPrivate *d;
  QReadLocker locker;
  QReadWriteLock *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (QCoreApplication::self == (QCoreApplication *)0x0) {
    local_19 = false;
  }
  else {
    QCoreApplication::d_func((QCoreApplication *)0x341ebe);
    QReadLocker::QReadLocker
              ((QReadLocker *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    local_19 = QListSpecialMethodsBase<QTranslator*>::contains<QTranslator*>
                         ((QListSpecialMethodsBase<QTranslator_*> *)
                          CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                          (QTranslator **)in_stack_ffffffffffffffc8);
    QReadLocker::~QReadLocker((QReadLocker *)0x341f0b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)
{
    if (!QCoreApplication::self)
        return false;
    QCoreApplicationPrivate *d = QCoreApplication::self->d_func();
    QReadLocker locker(&d->translateMutex);
    return d->translators.contains(translator);
}